

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_repeat::build_graph(test_repeat *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  
  uVar1 = ggml_new_tensor_4d(ctx,this->type,(long)(this->nr)._M_elems[0] * (this->ne)._M_elems[0],
                             (long)(this->nr)._M_elems[1] * (this->ne)._M_elems[1],
                             (long)(this->nr)._M_elems[2] * (this->ne)._M_elems[2],
                             (long)(this->nr)._M_elems[3] * (this->ne)._M_elems[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar1,"target");
  uVar2 = ggml_new_tensor(ctx,this->type,4,&this->ne);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,uVar2);
  ggml_set_name(uVar2,"src");
  pgVar3 = (ggml_tensor *)ggml_repeat(ctx,uVar2,uVar1);
  ggml_set_name(pgVar3,"out");
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * target = ggml_new_tensor_4d(ctx, type, ne[0]*nr[0], ne[1]*nr[1], ne[2]*nr[2], ne[3]*nr[3]);
        ggml_set_name(target, "target");

        ggml_tensor * src = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, src);
        ggml_set_name(src, "src");

        ggml_tensor * out = ggml_repeat(ctx, src, target);
        ggml_set_name(out, "out");

        return out;
    }